

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_GetAvailableFrames
                  (PaAlsaStreamComponent *self,unsigned_long *numFrames,int *xrunOccurred)

{
  unsigned_long uVar1;
  
  uVar1 = snd_pcm_avail_update();
  *xrunOccurred = 0;
  if (uVar1 == 0xffffffffffffffe0) {
    *xrunOccurred = 1;
    uVar1 = 0;
  }
  else if ((int)uVar1 < 0) {
    PaAlsaStreamComponent_GetAvailableFrames_cold_1();
    return -9999;
  }
  *numFrames = uVar1;
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_GetAvailableFrames( PaAlsaStreamComponent *self, unsigned long *numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    snd_pcm_sframes_t framesAvail = alsa_snd_pcm_avail_update( self->pcm );
    *xrunOccurred = 0;

    if( -EPIPE == framesAvail )
    {
        *xrunOccurred = 1;
        framesAvail = 0;
    }
    else
    {
        ENSURE_( framesAvail, paUnanticipatedHostError );
    }

    *numFrames = framesAvail;

error:
    return result;
}